

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O2

TokenType __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
checkIntLiteralRange
          (Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           *this,bool isNegative)

{
  bool bVar1;
  CompileMessage CStack_58;
  
  bVar1 = TokenType::operator==(&this->literalType,(TokenType *)&Token::literalInt32);
  if (bVar1) {
    if (isNegative) {
      if (this->literalIntValue < 0x80000001) goto LAB_002006a3;
      Errors::integerLiteralNeedsSuffix<>();
      (*this->_vptr_Tokeniser[2])(this,&CStack_58);
    }
    else {
      if (this->literalIntValue < 0x80000000) goto LAB_002006a3;
      Errors::integerLiteralNeedsSuffix<>();
      (*this->_vptr_Tokeniser[2])(this,&CStack_58);
    }
    CompileMessage::~CompileMessage(&CStack_58);
  }
LAB_002006a3:
  return (TokenType)(this->literalType).text;
}

Assistant:

TokenType checkIntLiteralRange (bool isNegative)
    {
        if (literalType == Token::literalInt32)
        {
            if (isNegative && literalIntValue > -static_cast<int64_t> (std::numeric_limits<int32_t>::min()))
                throwError (Errors::integerLiteralNeedsSuffix());

            if (! isNegative && literalIntValue > static_cast<int64_t> (std::numeric_limits<int32_t>::max()))
                throwError (Errors::integerLiteralNeedsSuffix());
        }

        return literalType;
    }